

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunnerTest.cpp
# Opt level: O0

void __thiscall
TEST_CommandLineTestRunner_testsCanBeRunInReverseOrder_Test::testBody
          (TEST_CommandLineTestRunner_testsCanBeRunInReverseOrder_Test *this)

{
  SimpleString *pSVar1;
  UtestShell *pUVar2;
  char *pcVar3;
  TestRegistry *this_00;
  SimpleString local_a0;
  undefined1 local_90 [8];
  SimpleStringCollection stringCollection;
  undefined1 local_60 [8];
  CommandLineTestRunnerWithStringBufferOutput commandLineTestRunner;
  char *argv [3];
  TEST_CommandLineTestRunner_testsCanBeRunInReverseOrder_Test *this_local;
  
  commandLineTestRunner.fakeTCOutputWhichIsReallyABuffer =
       (StringBufferTestOutput *)anon_var_dwarf_66e4;
  this_00 = &(this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).registry;
  TestRegistry::addTest(this_00,(this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).test2);
  CommandLineTestRunnerWithStringBufferOutput::CommandLineTestRunnerWithStringBufferOutput
            ((CommandLineTestRunnerWithStringBufferOutput *)local_60,3,
             (char **)&commandLineTestRunner.fakeTCOutputWhichIsReallyABuffer,this_00);
  CommandLineTestRunner::runAllTestsMain((CommandLineTestRunner *)local_60);
  SimpleStringCollection::SimpleStringCollection((SimpleStringCollection *)local_90);
  pSVar1 = StringBufferTestOutput::getOutput
                     (commandLineTestRunner.fakeJUnitOutputWhichIsReallyABuffer_);
  SimpleString::SimpleString(&local_a0,"\n");
  SimpleString::split(pSVar1,&local_a0,(SimpleStringCollection *)local_90);
  SimpleString::~SimpleString(&local_a0);
  pUVar2 = UtestShell::getCurrent();
  pSVar1 = SimpleStringCollection::operator[]((SimpleStringCollection *)local_90,0);
  pcVar3 = SimpleString::asCharString(pSVar1);
  (*pUVar2->_vptr_UtestShell[0xc])
            (pUVar2,"test1",pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineTestRunnerTest.cpp"
             ,0xf7);
  pUVar2 = UtestShell::getCurrent();
  pSVar1 = SimpleStringCollection::operator[]((SimpleStringCollection *)local_90,1);
  pcVar3 = SimpleString::asCharString(pSVar1);
  (*pUVar2->_vptr_UtestShell[0xc])
            (pUVar2,"test2",pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineTestRunnerTest.cpp"
             ,0xf8);
  SimpleStringCollection::~SimpleStringCollection((SimpleStringCollection *)local_90);
  CommandLineTestRunnerWithStringBufferOutput::~CommandLineTestRunnerWithStringBufferOutput
            ((CommandLineTestRunnerWithStringBufferOutput *)local_60);
  return;
}

Assistant:

TEST(CommandLineTestRunner, testsCanBeRunInReverseOrder)
{
    const char* argv[] = { "tests.exe", "-v", "-b"};

    registry.addTest(test2);
    CommandLineTestRunnerWithStringBufferOutput commandLineTestRunner(3, argv, &registry);
    commandLineTestRunner.runAllTestsMain();

    SimpleStringCollection stringCollection;
    commandLineTestRunner.fakeConsoleOutputWhichIsReallyABuffer->getOutput().split("\n", stringCollection);
    STRCMP_CONTAINS("test1", stringCollection[0].asCharString());
    STRCMP_CONTAINS("test2", stringCollection[1].asCharString());
}